

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseJacocoCoverage.cxx
# Opt level: O1

void __thiscall
cmParseJacocoCoverage::XMLParser::XMLParser
          (XMLParser *this,cmCTest *ctest,cmCTestCoverageHandlerContainer *cont)

{
  cmXMLParser::cmXMLParser(&this->super_cmXMLParser);
  (this->super_cmXMLParser)._vptr_cmXMLParser = (_func_int **)&PTR__XMLParser_006b9820;
  (this->PackageName)._M_dataplus._M_p = (pointer)&(this->PackageName).field_2;
  (this->PackageName)._M_string_length = 0;
  (this->PackageName).field_2._M_local_buf[0] = '\0';
  (this->FileName)._M_dataplus._M_p = (pointer)&(this->FileName).field_2;
  (this->FileName)._M_string_length = 0;
  (this->FileName).field_2._M_local_buf[0] = '\0';
  (this->ModuleName)._M_dataplus._M_p = (pointer)&(this->ModuleName).field_2;
  (this->ModuleName)._M_string_length = 0;
  (this->ModuleName).field_2._M_local_buf[0] = '\0';
  (this->CurFileName)._M_dataplus._M_p = (pointer)&(this->CurFileName).field_2;
  (this->CurFileName)._M_string_length = 0;
  (this->CurFileName).field_2._M_local_buf[0] = '\0';
  (this->FilePaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FilePaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FilePaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->CTest = ctest;
  this->Coverage = cont;
  std::__cxx11::string::_M_replace((ulong)&this->PackageName,0,(char *)0x0,0x5e5069);
  std::__cxx11::string::_M_replace
            ((ulong)&this->ModuleName,0,(char *)(this->ModuleName)._M_string_length,0x5e5069);
  std::__cxx11::string::_M_replace
            ((ulong)&this->FileName,0,(char *)(this->FileName)._M_string_length,0x5e5069);
  std::__cxx11::string::_M_replace
            ((ulong)&this->CurFileName,0,(char *)(this->CurFileName)._M_string_length,0x5e5069);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->FilePaths,&this->Coverage->SourceDir);
  return;
}

Assistant:

XMLParser(cmCTest* ctest, cmCTestCoverageHandlerContainer& cont)
      : CTest(ctest), Coverage(cont)
      {
      this->PackageName = "";
      this->ModuleName = "";
      this->FileName = "";
      this->CurFileName = "";
      this->FilePaths.push_back(this->Coverage.SourceDir);
      }